

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

bool CheckSkipOptionBlock(FScanner *sc)

{
  bool bVar1;
  bool bVar2;
  bool filter;
  FScanner *sc_local;
  
  bVar2 = false;
  FScanner::MustGetStringName(sc,"(");
  do {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"ReadThis");
    if (bVar1) {
      bVar2 = bVar2 || (gameinfo.drawreadthis & 1U) != 0;
    }
    else {
      bVar1 = FScanner::Compare(sc,"Swapmenu");
      if (bVar1) {
        bVar2 = bVar2 || (gameinfo.swapmenu & 1U) != 0;
      }
      else {
        bVar1 = FScanner::Compare(sc,"Windows");
        if (!bVar1) {
          bVar1 = FScanner::Compare(sc,"unix");
          if (bVar1) {
            bVar2 = true;
          }
          else {
            bVar1 = FScanner::Compare(sc,"Mac");
            if (!bVar1) {
              bVar1 = FScanner::Compare(sc,"OpenAL");
              if (bVar1) {
                bVar1 = IsOpenALPresent();
                bVar2 = bVar2 || bVar1;
              }
              else {
                bVar1 = FScanner::Compare(sc,"FModEx");
                if (bVar1) {
                  bVar1 = IsFModExPresent();
                  bVar2 = bVar2 || bVar1;
                }
              }
            }
          }
        }
      }
    }
    bVar1 = FScanner::CheckString(sc,",");
  } while (bVar1);
  FScanner::MustGetStringName(sc,")");
  if (bVar2) {
    sc_local._7_1_ = false;
  }
  else {
    SkipSubBlock(sc);
    bVar2 = FScanner::CheckString(sc,"else");
    sc_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
  }
  return sc_local._7_1_;
}

Assistant:

static bool CheckSkipOptionBlock(FScanner &sc)
{
	bool filter = false;
	sc.MustGetStringName("(");
	do
	{
		sc.MustGetString();
		if (sc.Compare("ReadThis")) filter |= gameinfo.drawreadthis;
		else if (sc.Compare("Swapmenu")) filter |= gameinfo.swapmenu;
		else if (sc.Compare("Windows"))
		{
			#ifdef _WIN32
				filter = true;
			#endif
		}
		else if (sc.Compare("unix"))
		{
			#ifdef __unix__
				filter = true;
			#endif
		}
		else if (sc.Compare("Mac"))
		{
			#ifdef __APPLE__
				filter = true;
			#endif
		}
		else if (sc.Compare("OpenAL"))
		{
			filter |= IsOpenALPresent();
		}
		else if (sc.Compare("FModEx"))
		{
			filter |= IsFModExPresent();
		}
	}
	while (sc.CheckString(","));
	sc.MustGetStringName(")");
	if (!filter)
	{
		SkipSubBlock(sc);
		return !sc.CheckString("else");
	}
	return false;
}